

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::DeclarationStatement::DeclarationStatement
          (DeclarationStatement *this,GeneratorState *state,Variable *variable)

{
  Variable **ppVVar1;
  pointer *ppuVar2;
  Storage SVar3;
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess other;
  bool bVar4;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *pvVar5;
  ValueEntry *pVVar6;
  Scalar *pSVar7;
  Expression *pEVar8;
  Scalar *pSVar9;
  pointer __x;
  ExpressionGenerator generator;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> candidates;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__DeclarationStatement_00190b68;
  this->m_variable = (Variable *)0x0;
  this->m_expression = (Expression *)0x0;
  if (variable == (Variable *)0x0) {
    pvVar5 = VariableManager::getLiveVariables(state->m_varManager);
    candidates.super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    candidates.super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    candidates.super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (__x = (pvVar5->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
        __x != (pvVar5->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>).
               _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      if ((*__x)->m_storage == STORAGE_LOCAL) {
        std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back(&candidates,__x);
      }
    }
    variable = de::Random::
               choose<rsg::Variable*,__gnu_cxx::__normal_iterator<rsg::Variable**,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>>
                         (state->m_random,
                          (__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                           )candidates.
                            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                           )candidates.
                            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~_Vector_base
              (&candidates.super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>);
  }
  ppVVar1 = &this->m_variable;
  *ppVVar1 = variable;
  pVVar6 = VariableManager::getValue(state->m_varManager,variable);
  if ((*ppVVar1)->m_storage == STORAGE_CONST) {
LAB_0013f2dd:
    ExpressionGenerator::ExpressionGenerator(&generator,state);
    pSVar7 = (pVVar6->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar9 = (pVVar6->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar7 == (pVVar6->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar7 = (Scalar *)0x0;
    }
    if (pSVar9 == (pVVar6->m_valueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar9 = (Scalar *)0x0;
    }
    other.m_min = pSVar7;
    other.m_type = &(pVVar6->m_valueRange).m_type;
    other.m_max = pSVar9;
    ValueRange::ValueRange((ValueRange *)&candidates,other);
    VariableManager::declareVariable(state->m_varManager,variable);
    SVar3 = (*ppVVar1)->m_storage;
    if (SVar3 == STORAGE_CONST) {
      GeneratorState::pushExpressionFlags
                (state,(state->m_exprFlagStack).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1] | 1);
    }
    pEVar8 = ExpressionGenerator::generate(&generator,(ValueRange *)&candidates,1);
    this->m_expression = pEVar8;
    if (SVar3 == STORAGE_CONST) {
      ppuVar2 = &(state->m_exprFlagStack).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
    }
    ValueRange::~ValueRange((ValueRange *)&candidates);
    ExpressionGenerator::~ExpressionGenerator(&generator);
  }
  else {
    if (((*ppVVar1)->m_storage == STORAGE_LOCAL) && (pVVar6 != (ValueEntry *)0x0)) {
      pSVar7 = (pVVar6->m_valueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar9 = (pVVar6->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pSVar7 == (pVVar6->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        pSVar7 = (Scalar *)0x0;
      }
      if (pSVar9 == (pVVar6->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        pSVar9 = (Scalar *)0x0;
      }
      valueRange.m_min = pSVar7;
      valueRange.m_type = &(pVVar6->m_valueRange).m_type;
      valueRange.m_max = pSVar9;
      bVar4 = isUndefinedValueRange(valueRange);
      if (!bVar4) goto LAB_0013f2dd;
    }
    VariableManager::declareVariable(state->m_varManager,variable);
  }
  return;
}

Assistant:

DeclarationStatement::DeclarationStatement (GeneratorState& state, Variable* variable)
	: m_variable	(DE_NULL)
	, m_expression	(DE_NULL)
{
	if (variable == DE_NULL)
	{
		// Choose random
		// \todo [2011-02-03 pyry] Allocate a new here?
		// \todo [2011-05-26 pyry] Weights?
		const vector<Variable*>&	liveVars = state.getVariableManager().getLiveVariables();
		vector<Variable*>			candidates;

		for (vector<Variable*>::const_iterator i = liveVars.begin(); i != liveVars.end(); i++)
		{
			if (canDeclareVariable(*i))
				candidates.push_back(*i);
		}

		variable = state.getRandom().choose<Variable*>(candidates.begin(), candidates.end());
	}

	DE_ASSERT(variable);
	m_variable = variable;

	const ValueEntry* value = state.getVariableManager().getValue(variable);

	bool createInitializer = false;

	switch (m_variable->getStorage())
	{
		case Variable::STORAGE_CONST:
			DE_ASSERT(value);
			createInitializer = true;
			break;

		case Variable::STORAGE_LOCAL:
			// \note Currently booleans are always treated as not having undefined range and thus
			//       initializer is always created.
			createInitializer = value && !isUndefinedValueRange(value->getValueRange());
			break;

		default:
			createInitializer = false;
			break;
	}

	if (createInitializer)
	{
		ExpressionGenerator generator(state);

		// Take copy of value range for generating initializer expression
		ValueRange valueRange = value->getValueRange();

		// Declare (removes value entry)
		state.getVariableManager().declareVariable(variable);

		bool isConst = m_variable->getStorage() == Variable::STORAGE_CONST;

		if (isConst)
			state.pushExpressionFlags(state.getExpressionFlags() | CONST_EXPR);

		m_expression = generator.generate(valueRange, 1);

		if (isConst)
			state.popExpressionFlags();
	}
	else
		state.getVariableManager().declareVariable(variable);
}